

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O2

int VELOCYPACK_XXH128_cmp(void *h128_1,void *h128_2)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  
  uVar1 = *(ulong *)((long)h128_1 + 8);
  uVar2 = *(ulong *)((long)h128_2 + 8);
  iVar3 = (uint)(uVar1 >= uVar2 && uVar1 != uVar2) - (uint)(uVar1 < uVar2);
  if (iVar3 != 0) {
    return iVar3;
  }
  uVar1 = *h128_1;
  uVar2 = *h128_2;
  return (uint)(uVar1 >= uVar2 && uVar1 != uVar2) - (uint)(uVar1 < uVar2);
}

Assistant:

XXH_PUBLIC_API int XXH128_cmp(const void* h128_1, const void* h128_2) {
  XXH128_hash_t const h1 = *(const XXH128_hash_t*)h128_1;
  XXH128_hash_t const h2 = *(const XXH128_hash_t*)h128_2;
  int const hcmp = (h1.high64 > h2.high64) - (h2.high64 > h1.high64);
  /* note : bets that, in most cases, hash values are different */
  if (hcmp) return hcmp;
  return (h1.low64 > h2.low64) - (h2.low64 > h1.low64);
}